

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token slang::parsing::Lexer::concatenateTokens
                (BumpAllocator *alloc,SourceManager *sourceManager,Token left,Token right)

{
  SourceLocation SVar1;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *dst;
  uint32_t extraout_var;
  Info *extraout_RDX;
  EVP_PKEY_CTX *ctx;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar2;
  string_view sVar3;
  Token TVar4;
  Token local_4d8;
  Token token;
  string_view rightText;
  string_view leftText;
  LexerOptions local_470;
  Token right_local;
  Token left_local;
  Diagnostics unused;
  Lexer lexer;
  
  right_local.info = right.info;
  right_local._0_8_ = right._0_8_;
  left_local.info = left.info;
  left_local._0_8_ = left._0_8_;
  SVar1 = Token::location(&left_local);
  sVar2 = Token::trivia(&left_local);
  leftText = Token::rawText(&left_local);
  src = (EVP_PKEY_CTX *)leftText._M_len;
  rightText = Token::rawText(&right_local);
  src_00 = (EVP_PKEY_CTX *)rightText._M_len;
  if (src_00 == (EVP_PKEY_CTX *)0x0 || src == (EVP_PKEY_CTX *)0x0) {
    Token::Token(&local_4d8);
    goto LAB_0034118f;
  }
  dst = (EVP_PKEY_CTX *)BumpAllocator::allocate(alloc,(size_t)(src + (long)src_00 + 1),1);
  std::basic_string_view<char,_std::char_traits<char>_>::copy(&leftText,dst,src);
  std::basic_string_view<char,_std::char_traits<char>_>::copy
            (&rightText,dst + leftText._M_len,src_00);
  dst[(long)(src + (long)src_00)] = (EVP_PKEY_CTX)0x0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)unused.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len = 0;
  unused.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::unordered_flat_map(&local_470.commentHandlers);
  local_470.maxErrors = 0x10;
  local_470.languageVersion = Default;
  local_470.enableLegacyProtect = false;
  ctx = (EVP_PKEY_CTX *)0xffffffffffffffff;
  sVar3._M_str = (char *)dst;
  sVar3._M_len = (size_t)(src + (long)src_00 + 1);
  Lexer(&lexer,(BufferID)0xffffffff,sVar3,(char *)dst,alloc,&unused,sourceManager,&local_470);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_470);
  token = lex(&lexer);
  if (token.kind == Unknown) {
LAB_0034116d:
    Token::Token(&local_4d8);
  }
  else {
    sVar3 = Token::rawText(&token);
    if (sVar3._M_len == 0) goto LAB_0034116d;
    TVar4 = lex(&lexer);
    if (TVar4.kind != EndOfFile) goto LAB_0034116d;
    sVar3 = Token::rawText(&token);
    local_4d8._0_4_ =
         Token::clone(&token,(__fn *)alloc,sVar2._M_ptr,(int)sVar2._M_extent._M_extent_value,
                      (void *)sVar3._M_len,sVar3._M_str,SVar1);
    local_4d8.rawLen = extraout_var;
    ctx = (EVP_PKEY_CTX *)0x34113f;
    local_4d8.info = extraout_RDX;
  }
  ~Lexer(&lexer);
  SmallVectorBase<slang::Diagnostic>::cleanup((SmallVectorBase<slang::Diagnostic> *)&unused,ctx);
LAB_0034118f:
  TVar4.info = local_4d8.info;
  TVar4.kind = local_4d8.kind;
  TVar4._2_1_ = local_4d8._2_1_;
  TVar4.numFlags.raw = local_4d8.numFlags.raw;
  TVar4.rawLen = local_4d8.rawLen;
  return TVar4;
}

Assistant:

Token Lexer::concatenateTokens(BumpAllocator& alloc, SourceManager& sourceManager, Token left,
                               Token right) {
    auto location = left.location();
    auto trivia = left.trivia();

    // if either side is empty, we have an error; the user tried to concatenate some weird kind of
    // token
    auto leftText = left.rawText();
    auto rightText = right.rawText();
    if (leftText.empty() || rightText.empty())
        return Token();

    // combine the text for both sides; make sure to include room for a null
    size_t newLength = leftText.length() + rightText.length() + 1;
    char* mem = (char*)alloc.allocate(newLength, 1);
    leftText.copy(mem, leftText.length());
    rightText.copy(mem + leftText.length(), rightText.length());
    mem[newLength - 1] = '\0';
    std::string_view combined{mem, newLength};

    Diagnostics unused;
    Lexer lexer{BufferID::getPlaceholder(),
                combined,
                combined.data(),
                alloc,
                unused,
                sourceManager,
                LexerOptions{}};

    auto token = lexer.lex();
    if (token.kind == TokenKind::Unknown || token.rawText().empty())
        return Token();

    // make sure the next token is an EoF, otherwise the tokens were unable to
    // be combined and should be left alone
    if (lexer.lex().kind != TokenKind::EndOfFile)
        return Token();

    return token.clone(alloc, trivia, token.rawText(), location);
}